

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall tinyusdz::Path::operator<(Path *this,Path *rhs)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  string local_60;
  string local_40;
  
  full_path_name_abi_cxx11_(&local_60,this);
  full_path_name_abi_cxx11_(&local_40,rhs);
  if (local_60._M_string_length == local_40._M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_60._M_dataplus._M_p,local_40._M_dataplus._M_p,local_60._M_string_length);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    sVar1 = (rhs->_prim_part)._M_string_length;
    if ((this->_prim_part)._M_string_length == 0) {
      return sVar1 != 0;
    }
    if (sVar1 != 0) {
      bVar3 = LessThan(this,rhs);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool operator<(const Path &rhs) const {
    if (full_path_name() == rhs.full_path_name()) {
      return false;
    }

    if (prim_part().empty() || rhs.prim_part().empty()) {
      return prim_part().empty() && rhs.prim_part().size();
    }

    return LessThan(*this, rhs);
  }